

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O0

void __thiscall
kratos::Property::Property
          (Property *this,string *property_name,shared_ptr<kratos::Sequence> *sequence)

{
  shared_ptr<kratos::Sequence> *sequence_local;
  string *property_name_local;
  Property *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)property_name);
  std::shared_ptr<kratos::Sequence>::shared_ptr(&this->sequence_,sequence);
  EventControl::EventControl(&this->edge_,0);
  this->action_ = None;
  return;
}

Assistant:

Property::Property(std::string property_name, std::shared_ptr<Sequence> sequence)
    : property_name_(std::move(property_name)), sequence_(std::move(sequence)) {}